

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmGeneratorTarget::GetIncludeDirectories
          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *lang)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  cmMakefile *this_00;
  pointer pcVar3;
  cmLinkImplItem *this_01;
  cmGeneratorTarget *pcVar4;
  cmLocalGenerator *pcVar5;
  pointer pcVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  PolicyStatus PVar10;
  iterator iVar11;
  string *psVar12;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var13;
  cmValue __args;
  ostream *poVar14;
  string *psVar15;
  long *plVar16;
  cmake *this_02;
  undefined8 *puVar17;
  cmLinkImplementationLibraries *pcVar18;
  string *psVar19;
  size_type *psVar20;
  element_type *peVar21;
  PolicyID id;
  PolicyID id_00;
  pointer this_03;
  pointer pEVar22;
  MessageType MVar23;
  bool bVar24;
  string_view value;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar25;
  string fwInclude;
  string propertyName;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_378;
  undefined1 local_368 [32];
  long *local_348;
  long local_340;
  long local_338 [2];
  pointer local_328;
  PolicyMap *local_320;
  long local_318;
  _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>>
  *local_310;
  pointer local_308;
  cmListFileBacktrace *local_300;
  EvaluatedTargetPropertyEntries entries;
  cmList debugProperties;
  string obj_dir;
  ios_base local_250 [16];
  bool local_240;
  string local_148;
  ConfigAndLanguage cacheKey;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqueIncludes;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&cacheKey,config,lang);
  iVar11 = std::
           _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
           ::find(&(this->IncludeDirectoriesCache)._M_t,&cacheKey);
  if ((_Rb_tree_header *)iVar11._M_node ==
      &(this->IncludeDirectoriesCache)._M_t._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->
    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uniqueIncludes._M_h._M_buckets = &uniqueIncludes._M_h._M_single_bucket;
    uniqueIncludes._M_h._M_bucket_count = 1;
    uniqueIncludes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    uniqueIncludes._M_h._M_element_count = 0;
    uniqueIncludes._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    uniqueIncludes._M_h._M_rehash_policy._M_next_resize = 0;
    uniqueIncludes._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"INCLUDE_DIRECTORIES","");
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&dagChecker,this,&local_148,(GeneratorExpressionContent *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    this_00 = this->Makefile;
    propertyName._M_dataplus._M_p = (pointer)&propertyName.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&propertyName,"CMAKE_DEBUG_TARGET_PROPERTIES","");
    psVar12 = (string *)cmMakefile::GetDefinition(this_00,&propertyName);
    if (psVar12 == (string *)0x0) {
      psVar12 = &cmValue::Empty_abi_cxx11_;
    }
    paVar1 = &obj_dir.field_2;
    pcVar3 = (psVar12->_M_dataplus)._M_p;
    obj_dir._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&obj_dir,pcVar3,pcVar3 + psVar12->_M_string_length);
    init._M_len = 1;
    init._M_array = &obj_dir;
    cmList::cmList(&debugProperties,init);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)obj_dir._M_dataplus._M_p != paVar1) {
      operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)propertyName._M_dataplus._M_p != &propertyName.field_2) {
      operator_delete(propertyName._M_dataplus._M_p,
                      CONCAT71(propertyName.field_2._M_allocated_capacity._1_7_,
                               propertyName.field_2._M_local_buf[0]) + 1);
    }
    if (this->DebugIncludesDone == false) {
      _Var13 = std::
               __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[20]>>
                         (debugProperties.Values.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          debugProperties.Values.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,"INCLUDE_DIRECTORIES");
      bVar8 = _Var13._M_current !=
              debugProperties.Values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      bVar8 = false;
    }
    if (this->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == true) {
      this->DebugIncludesDone = true;
    }
    EvaluateTargetPropertyEntries
              (&entries,this,config,lang,&dagChecker,&this->IncludeDirectoriesEntries);
    local_310 = (_Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>>
                 *)&this->IncludeDirectoriesCache;
    iVar9 = std::__cxx11::string::compare((char *)lang);
    if (iVar9 == 0) {
      obj_dir._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&obj_dir,"Swift_MODULE_DIRECTORY","");
      anon_unknown.dwarf_1cef62d::AddLangSpecificImplicitIncludeDirectories
                (this,lang,config,&obj_dir,BINARY,&entries);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)obj_dir._M_dataplus._M_p != paVar1) {
        operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
      }
    }
    bVar7 = cmTarget::CanCompileSources(this->Target);
    if (((bVar7) && (iVar9 = std::__cxx11::string::compare((char *)lang), iVar9 != 0)) &&
       (iVar9 = std::__cxx11::string::compare((char *)lang), iVar9 != 0)) {
      propertyName._M_dataplus._M_p = (pointer)&propertyName.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&propertyName,"ISPC_HEADER_DIRECTORY","");
      GetAllConfigCompileLanguages_abi_cxx11_
                ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&obj_dir,this);
      bVar7 = ::cm::
              contains<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char[5],_0>
                        ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&obj_dir,(char (*) [5])"ISPC");
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&obj_dir);
      if (bVar7) {
        __args = GetProperty(this,&propertyName);
        if (__args.Value == (string *)0x0) {
          (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x18])
                    (&obj_dir,this->GlobalGenerator,&this->ObjectDirectory,config);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<std::__cxx11::string>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     __return_storage_ptr__,&obj_dir);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)obj_dir._M_dataplus._M_p != paVar1) {
            operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     __return_storage_ptr__,__args.Value);
        }
      }
      obj_dir._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&obj_dir,"ISPC","");
      anon_unknown.dwarf_1cef62d::AddLangSpecificImplicitIncludeDirectories
                (this,&obj_dir,config,&propertyName,OBJECT,&entries);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)obj_dir._M_dataplus._M_p != paVar1) {
        operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)propertyName._M_dataplus._M_p != &propertyName.field_2) {
        operator_delete(propertyName._M_dataplus._M_p,
                        CONCAT71(propertyName.field_2._M_allocated_capacity._1_7_,
                                 propertyName.field_2._M_local_buf[0]) + 1);
      }
    }
    obj_dir._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&obj_dir,"INTERFACE_INCLUDE_DIRECTORIES","");
    AddInterfaceEntries(this,config,&obj_dir,lang,&dagChecker,&entries,Yes,Usage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)obj_dir._M_dataplus._M_p != paVar1) {
      operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
    }
    local_308 = entries.Entries.
                super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (entries.Entries.
        super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        entries.Entries.
        super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_320 = &this->PolicyMap;
      pEVar22 = entries.Entries.
                super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        this_01 = pEVar22->LinkImplItem;
        local_368._24_8_ = cmLinkItem::AsStr_abi_cxx11_(&this_01->super_cmLinkItem);
        pcVar4 = (this_01->super_cmLinkItem).Target;
        if (pcVar4 == (cmGeneratorTarget *)0x0) {
          bVar7 = false;
        }
        else {
          bVar7 = cmTarget::IsImported(pcVar4->Target);
        }
        bVar2 = this_01->CheckCMP0027;
        propertyName._M_dataplus._M_p = (pointer)&propertyName.field_2;
        propertyName._M_string_length = 0;
        propertyName.field_2._M_local_buf[0] = '\0';
        psVar12 = (pEVar22->Values).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar19 = (pEVar22->Values).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        bVar24 = psVar12 == psVar19;
        local_328 = pEVar22;
        if (!bVar24) {
          local_300 = &pEVar22->Backtrace;
          do {
            if ((bVar7 != false) && (bVar24 = cmsys::SystemTools::FileExists(psVar12), !bVar24)) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&obj_dir);
              MVar23 = FATAL_ERROR;
              if (bVar2 != false) {
                PVar10 = cmPolicies::PolicyMap::Get(local_320,CMP0027);
                if (PVar10 != OLD) {
                  if (PVar10 != WARN) goto LAB_004b07d0;
                  cmPolicies::GetPolicyWarning_abi_cxx11_(&fwInclude,(cmPolicies *)0x1b,id_00);
                  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&obj_dir,fwInclude._M_dataplus._M_p,
                                       fwInclude._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)fwInclude._M_dataplus._M_p != &fwInclude.field_2) {
                    operator_delete(fwInclude._M_dataplus._M_p,
                                    fwInclude.field_2._M_allocated_capacity + 1);
                  }
                }
                MVar23 = AUTHOR_WARNING;
              }
LAB_004b07d0:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&obj_dir,"Imported target \"",0x11);
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&obj_dir,((_Alloc_hider *)local_368._24_8_)->_M_p,
                                   *(size_type *)(local_368._24_8_ + 8));
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14,"\" includes non-existent path\n  \"",0x20);
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar14,(psVar12->_M_dataplus)._M_p,psVar12->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14,
                         "\"\nin its INTERFACE_INCLUDE_DIRECTORIES. Possible reasons include:\n* The path was deleted, renamed, or moved to another location.\n* An install or uninstall procedure did not complete successfully.\n* The installation package was faulty and references files it does not provide.\n"
                         ,0x114);
              pcVar5 = this->LocalGenerator;
              std::__cxx11::stringbuf::str();
              cmLocalGenerator::IssueMessage(pcVar5,MVar23,&fwInclude);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fwInclude._M_dataplus._M_p != &fwInclude.field_2) {
                operator_delete(fwInclude._M_dataplus._M_p,
                                fwInclude.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&obj_dir);
              std::ios_base::~ios_base(local_250);
LAB_004b08ca:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)propertyName._M_dataplus._M_p != &propertyName.field_2) {
                operator_delete(propertyName._M_dataplus._M_p,
                                CONCAT71(propertyName.field_2._M_allocated_capacity._1_7_,
                                         propertyName.field_2._M_local_buf[0]) + 1);
              }
              goto LAB_004b08e6;
            }
            bVar24 = cmsys::SystemTools::FileIsFullPath(psVar12);
            if (!bVar24) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&obj_dir);
              if (*(size_type *)(local_368._24_8_ + 8) == 0) {
                PVar10 = cmPolicies::PolicyMap::Get(local_320,CMP0021);
                MVar23 = FATAL_ERROR;
                if (PVar10 == OLD) {
                  bVar24 = true;
                }
                else {
                  if (PVar10 == WARN) {
                    cmPolicies::GetPolicyWarning_abi_cxx11_(&fwInclude,(cmPolicies *)0x15,id);
                    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&obj_dir,fwInclude._M_dataplus._M_p,
                                         fwInclude._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)fwInclude._M_dataplus._M_p != &fwInclude.field_2) {
                      operator_delete(fwInclude._M_dataplus._M_p,
                                      fwInclude.field_2._M_allocated_capacity + 1);
                    }
                    MVar23 = AUTHOR_WARNING;
                  }
                  bVar24 = false;
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&obj_dir,
                           "Found relative path while evaluating include directories of \"",0x3d);
                psVar15 = cmTarget::GetName_abi_cxx11_(this->Target);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&obj_dir,(psVar15->_M_dataplus)._M_p,
                                     psVar15->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\":\n  \"",6);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar14,(psVar12->_M_dataplus)._M_p,psVar12->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\"\n",2);
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&obj_dir,"Target \"",8);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&obj_dir,((_Alloc_hider *)local_368._24_8_)->_M_p,
                                     *(size_type *)(local_368._24_8_ + 8));
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,
                           "\" contains relative path in its INTERFACE_INCLUDE_DIRECTORIES:\n  \"",
                           0x42);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar14,(psVar12->_M_dataplus)._M_p,psVar12->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\"",1);
                MVar23 = FATAL_ERROR;
                bVar24 = false;
              }
              if (!bVar24) {
                pcVar5 = this->LocalGenerator;
                std::__cxx11::stringbuf::str();
                cmLocalGenerator::IssueMessage(pcVar5,MVar23,&fwInclude);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)fwInclude._M_dataplus._M_p != &fwInclude.field_2) {
                  operator_delete(fwInclude._M_dataplus._M_p,
                                  fwInclude.field_2._M_allocated_capacity + 1);
                }
                if (MVar23 == FATAL_ERROR) {
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&obj_dir);
                  std::ios_base::~ios_base(local_250);
                  goto LAB_004b08ca;
                }
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&obj_dir);
              std::ios_base::~ios_base(local_250);
            }
            value._M_str = (psVar12->_M_dataplus)._M_p;
            value._M_len = psVar12->_M_string_length;
            bVar24 = cmValue::IsOff(value);
            if (!bVar24) {
              cmsys::SystemTools::ConvertToUnixSlashes(psVar12);
            }
            obj_dir._M_dataplus._M_p = (pointer)&uniqueIncludes;
            pVar25 = std::
                     _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                     ::
                     _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                               ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                 *)obj_dir._M_dataplus._M_p,psVar12,&obj_dir);
            if ((((undefined1  [16])pVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
               (std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                emplace_back<std::__cxx11::string&,cmListFileBacktrace&>
                          ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                            *)__return_storage_ptr__,psVar12,local_300), bVar8)) {
              std::operator+(&fwInclude," * ",psVar12);
              plVar16 = (long *)std::__cxx11::string::append((char *)&fwInclude);
              psVar20 = (size_type *)(plVar16 + 2);
              if ((size_type *)*plVar16 == psVar20) {
                obj_dir.field_2._M_allocated_capacity = *psVar20;
                obj_dir.field_2._8_8_ = plVar16[3];
                obj_dir._M_dataplus._M_p = (pointer)&obj_dir.field_2;
              }
              else {
                obj_dir.field_2._M_allocated_capacity = *psVar20;
                obj_dir._M_dataplus._M_p = (pointer)*plVar16;
              }
              obj_dir._M_string_length = plVar16[1];
              *plVar16 = (long)psVar20;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&propertyName,(ulong)obj_dir._M_dataplus._M_p)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)obj_dir._M_dataplus._M_p != &obj_dir.field_2) {
                operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fwInclude._M_dataplus._M_p != &fwInclude.field_2) {
                operator_delete(fwInclude._M_dataplus._M_p,
                                fwInclude.field_2._M_allocated_capacity + 1);
              }
            }
            psVar12 = psVar12 + 1;
            bVar24 = psVar12 == psVar19;
          } while (!bVar24);
        }
        pEVar22 = local_328;
        if (propertyName._M_string_length != 0) {
          this_02 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
          local_348 = local_338;
          local_318 = 0x19;
          local_348 = (long *)std::__cxx11::string::_M_create((ulong *)&local_348,(ulong)&local_318)
          ;
          local_338[0] = local_318;
          builtin_strncpy((char *)((long)local_348 + 9),"udes for",8);
          builtin_strncpy((char *)((long)local_348 + 0x11)," target ",8);
          *local_348 = 0x636e692064657355;
          local_348[1] = 0x6f6620736564756c;
          local_340 = local_318;
          *(char *)((long)local_348 + local_318) = '\0';
          psVar12 = cmTarget::GetName_abi_cxx11_(this->Target);
          puVar17 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_348,(ulong)(psVar12->_M_dataplus)._M_p);
          peVar21 = (element_type *)(puVar17 + 2);
          if ((element_type *)*puVar17 == peVar21) {
            local_368._0_8_ = (peVar21->Value).Name._M_dataplus._M_p;
            local_368._8_8_ = puVar17[3];
            local_378.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)local_368;
          }
          else {
            local_368._0_8_ = (peVar21->Value).Name._M_dataplus._M_p;
            local_378.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)*puVar17;
          }
          local_378.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar17[1];
          *puVar17 = peVar21;
          puVar17[1] = 0;
          *(undefined1 *)(puVar17 + 2) = 0;
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_378);
          fwInclude._M_dataplus._M_p = (pointer)&fwInclude.field_2;
          psVar20 = (size_type *)(plVar16 + 2);
          if ((size_type *)*plVar16 == psVar20) {
            fwInclude.field_2._M_allocated_capacity = *psVar20;
            fwInclude.field_2._8_8_ = plVar16[3];
          }
          else {
            fwInclude.field_2._M_allocated_capacity = *psVar20;
            fwInclude._M_dataplus._M_p = (pointer)*plVar16;
          }
          fwInclude._M_string_length = plVar16[1];
          *plVar16 = (long)psVar20;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          plVar16 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&fwInclude,(ulong)propertyName._M_dataplus._M_p);
          obj_dir._M_dataplus._M_p = (pointer)&obj_dir.field_2;
          psVar20 = (size_type *)(plVar16 + 2);
          if ((size_type *)*plVar16 == psVar20) {
            obj_dir.field_2._M_allocated_capacity = *psVar20;
            obj_dir.field_2._8_8_ = plVar16[3];
          }
          else {
            obj_dir.field_2._M_allocated_capacity = *psVar20;
            obj_dir._M_dataplus._M_p = (pointer)*plVar16;
          }
          obj_dir._M_string_length = plVar16[1];
          *plVar16 = (long)psVar20;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          cmake::IssueMessage(this_02,LOG,&obj_dir,&pEVar22->Backtrace);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)obj_dir._M_dataplus._M_p != &obj_dir.field_2) {
            operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fwInclude._M_dataplus._M_p != &fwInclude.field_2) {
            operator_delete(fwInclude._M_dataplus._M_p,fwInclude.field_2._M_allocated_capacity + 1);
          }
          if (local_378.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr != (element_type *)local_368) {
            operator_delete(local_378.TopEntry.
                            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,(ulong)(local_368._0_8_ + 1));
          }
          if (local_348 != local_338) {
            operator_delete(local_348,local_338[0] + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)propertyName._M_dataplus._M_p != &propertyName.field_2) {
          operator_delete(propertyName._M_dataplus._M_p,
                          CONCAT71(propertyName.field_2._M_allocated_capacity._1_7_,
                                   propertyName.field_2._M_local_buf[0]) + 1);
        }
        pEVar22 = pEVar22 + 1;
      } while ((bool)(bVar24 & pEVar22 != local_308));
    }
LAB_004b08e6:
    bVar8 = cmTarget::IsApple(this->Target);
    if ((bVar8) &&
       (pcVar18 = GetLinkImplementationLibrariesInternal(this,config,this,Usage),
       pcVar18 != (cmLinkImplementationLibraries *)0x0)) {
      this_03 = (pcVar18->Libraries).
                super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                super__Vector_impl_data._M_start;
      pcVar6 = (pcVar18->Libraries).
               super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (this_03 != pcVar6) {
        do {
          propertyName._M_dataplus._M_p = (pointer)&propertyName.field_2;
          propertyName._M_string_length = 0;
          propertyName.field_2._M_local_buf[0] = '\0';
          pcVar4 = (this_03->super_cmLinkItem).Target;
          if (pcVar4 == (cmGeneratorTarget *)0x0) {
            psVar12 = cmLinkItem::AsStr_abi_cxx11_(&this_03->super_cmLinkItem);
            psVar19 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_(this->Makefile);
            cmsys::SystemTools::CollapseFullPath(&obj_dir,psVar12,psVar19);
            std::__cxx11::string::operator=((string *)&propertyName,(string *)&obj_dir);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)obj_dir._M_dataplus._M_p != &obj_dir.field_2) {
              operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
            }
LAB_004b09f0:
            cmGlobalGenerator::SplitFrameworkPath
                      ((optional<cmGlobalGenerator::FrameworkDescriptor> *)&obj_dir,
                       this->LocalGenerator->GlobalGenerator,&propertyName,Relaxed);
            if (local_240 != false) {
              cmGlobalGenerator::FrameworkDescriptor::GetFrameworkPath_abi_cxx11_
                        (&fwInclude,(FrameworkDescriptor *)&obj_dir);
              local_378.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)&uniqueIncludes;
              pVar25 = std::
                       _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                       ::
                       _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                                 ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                   *)local_378.TopEntry.
                                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr,&fwInclude,&local_378);
              if (((undefined1  [16])pVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                local_378.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)0x0;
                local_378.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_378);
                std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                emplace_back<std::__cxx11::string&,cmListFileBacktrace>
                          ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                            *)__return_storage_ptr__,&fwInclude,(cmListFileBacktrace *)&local_378);
                if (local_378.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_378.TopEntry.
                             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fwInclude._M_dataplus._M_p != &fwInclude.field_2) {
                operator_delete(fwInclude._M_dataplus._M_p,
                                fwInclude.field_2._M_allocated_capacity + 1);
              }
            }
            if (local_240 == true) {
              std::_Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>::_M_destroy
                        ((_Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor> *)&obj_dir)
              ;
            }
          }
          else {
            bVar8 = cmTarget::IsFrameworkOnApple(pcVar4->Target);
            if ((bVar8) || (bVar8 = IsImportedFrameworkFolderOnApple(this,config), bVar8)) {
              GetLocation((this_03->super_cmLinkItem).Target,config);
              std::__cxx11::string::_M_assign((string *)&propertyName);
              goto LAB_004b09f0;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)propertyName._M_dataplus._M_p != &propertyName.field_2) {
            operator_delete(propertyName._M_dataplus._M_p,
                            CONCAT71(propertyName.field_2._M_allocated_capacity._1_7_,
                                     propertyName.field_2._M_local_buf[0]) + 1);
          }
          this_03 = this_03 + 1;
        } while (this_03 != pcVar6);
      }
    }
    std::
    _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>>
    ::
    _M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>&,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&>
              (local_310,&cacheKey,__return_storage_ptr__);
    std::vector<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>::
    ~vector(&entries.Entries);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&debugProperties.Values);
    if (dagChecker.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (dagChecker.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    std::
    _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&dagChecker.Seen._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dagChecker.Property._M_dataplus._M_p != &dagChecker.Property.field_2) {
      operator_delete(dagChecker.Property._M_dataplus._M_p,
                      dagChecker.Property.field_2._M_allocated_capacity + 1);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&uniqueIncludes._M_h);
  }
  else {
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(__return_storage_ptr__,
             (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(iVar11._M_node + 3));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cacheKey.second._M_dataplus._M_p != &cacheKey.second.field_2) {
    operator_delete(cacheKey.second._M_dataplus._M_p,
                    cacheKey.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cacheKey.first._M_dataplus._M_p != &cacheKey.first.field_2) {
    operator_delete(cacheKey.first._M_dataplus._M_p,cacheKey.first.field_2._M_allocated_capacity + 1
                   );
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<BT<std::string>> cmGeneratorTarget::GetIncludeDirectories(
  const std::string& config, const std::string& lang) const
{
  ConfigAndLanguage cacheKey(config, lang);
  {
    auto it = this->IncludeDirectoriesCache.find(cacheKey);
    if (it != this->IncludeDirectoriesCache.end()) {
      return it->second;
    }
  }
  std::vector<BT<std::string>> includes;
  std::unordered_set<std::string> uniqueIncludes;

  cmGeneratorExpressionDAGChecker dagChecker(this, "INCLUDE_DIRECTORIES",
                                             nullptr, nullptr);

  cmList debugProperties{ this->Makefile->GetDefinition(
    "CMAKE_DEBUG_TARGET_PROPERTIES") };
  bool debugIncludes = !this->DebugIncludesDone &&
    cm::contains(debugProperties, "INCLUDE_DIRECTORIES");

  if (this->GlobalGenerator->GetConfigureDoneCMP0026()) {
    this->DebugIncludesDone = true;
  }

  EvaluatedTargetPropertyEntries entries = EvaluateTargetPropertyEntries(
    this, config, lang, &dagChecker, this->IncludeDirectoriesEntries);

  if (lang == "Swift") {
    AddLangSpecificImplicitIncludeDirectories(
      this, lang, config, "Swift_MODULE_DIRECTORY",
      IncludeDirectoryFallBack::BINARY, entries);
  }

  if (this->CanCompileSources() && (lang != "Swift" && lang != "Fortran")) {

    const std::string propertyName = "ISPC_HEADER_DIRECTORY";

    // If this target has ISPC sources make sure to add the header
    // directory to other compilation units
    if (cm::contains(this->GetAllConfigCompileLanguages(), "ISPC")) {
      if (cmValue val = this->GetProperty(propertyName)) {
        includes.emplace_back(*val);
      } else {
        includes.emplace_back(this->GetObjectDirectory(config));
      }
    }

    AddLangSpecificImplicitIncludeDirectories(
      this, "ISPC", config, propertyName, IncludeDirectoryFallBack::OBJECT,
      entries);
  }

  AddInterfaceEntries(this, config, "INTERFACE_INCLUDE_DIRECTORIES", lang,
                      &dagChecker, entries, IncludeRuntimeInterface::Yes);

  processIncludeDirectories(this, entries, includes, uniqueIncludes,
                            debugIncludes);

  if (this->IsApple()) {
    if (cmLinkImplementationLibraries const* impl =
          this->GetLinkImplementationLibraries(config,
                                               LinkInterfaceFor::Usage)) {
      for (cmLinkImplItem const& lib : impl->Libraries) {
        std::string libDir;
        if (lib.Target == nullptr) {
          libDir = cmSystemTools::CollapseFullPath(
            lib.AsStr(), this->Makefile->GetHomeOutputDirectory());
        } else if (lib.Target->Target->IsFrameworkOnApple() ||
                   this->IsImportedFrameworkFolderOnApple(config)) {
          libDir = lib.Target->GetLocation(config);
        } else {
          continue;
        }

        auto fwDescriptor =
          this->GetGlobalGenerator()->SplitFrameworkPath(libDir);
        if (!fwDescriptor) {
          continue;
        }

        auto fwInclude = fwDescriptor->GetFrameworkPath();
        if (uniqueIncludes.insert(fwInclude).second) {
          includes.emplace_back(fwInclude, cmListFileBacktrace());
        }
      }
    }
  }

  this->IncludeDirectoriesCache.emplace(cacheKey, includes);
  return includes;
}